

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O1

void __thiscall QGraphicsAnchorLayoutPrivate::createLayoutEdges(QGraphicsAnchorLayoutPrivate *this)

{
  QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  *this_00;
  QGraphicsLayoutItem *firstItem;
  AnchorData *pAVar1;
  long in_FS_OFFSET;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> pVar2;
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  firstItem = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  pAVar1 = (AnchorData *)operator_new(0x80);
  (pAVar1->super_QSimplexVariable).result = 0.0;
  (pAVar1->super_QSimplexVariable).index = 0;
  pAVar1->_vptr_AnchorData = (_func_int **)&PTR__AnchorData_0081f120;
  pAVar1->from = (AnchorVertex *)0x0;
  pAVar1->to = (AnchorVertex *)0x0;
  pAVar1->minSize = 0.0;
  pAVar1->prefSize = 0.0;
  pAVar1->maxSize = 0.0;
  pAVar1->minPrefSize = 0.0;
  pAVar1->maxPrefSize = 0.0;
  pAVar1->sizeAtMinimum = 0.0;
  pAVar1->sizeAtPreferred = 0.0;
  pAVar1->sizeAtMaximum = 0.0;
  pAVar1->item = (QGraphicsLayoutItem *)0x0;
  pAVar1->graphicsAnchor = (QGraphicsAnchor *)0x0;
  pAVar1->field_0x78 = pAVar1->field_0x78 & 0x80;
  addAnchor_helper(this,firstItem,AnchorLeft,firstItem,AnchorRight,pAVar1);
  pAVar1->maxSize = 16777215.0;
  local_48.second = AnchorLeft;
  this_00 = &this->m_vertexList;
  local_48.first = firstItem;
  pVar2 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
          ::value(this_00,&local_48);
  (this->layoutFirstVertex).m_data[0] = pVar2.first;
  (this->layoutCentralVertex).m_data[0] = (AnchorVertex *)0x0;
  local_48.second = AnchorRight;
  local_48.first = firstItem;
  pVar2 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
          ::value(this_00,&local_48);
  (this->layoutLastVertex).m_data[0] = pVar2.first;
  pAVar1 = (AnchorData *)operator_new(0x80);
  (pAVar1->super_QSimplexVariable).result = 0.0;
  (pAVar1->super_QSimplexVariable).index = 0;
  pAVar1->_vptr_AnchorData = (_func_int **)&PTR__AnchorData_0081f120;
  pAVar1->from = (AnchorVertex *)0x0;
  pAVar1->to = (AnchorVertex *)0x0;
  pAVar1->minSize = 0.0;
  pAVar1->prefSize = 0.0;
  pAVar1->maxSize = 0.0;
  pAVar1->minPrefSize = 0.0;
  pAVar1->maxPrefSize = 0.0;
  pAVar1->sizeAtMinimum = 0.0;
  pAVar1->sizeAtPreferred = 0.0;
  pAVar1->sizeAtMaximum = 0.0;
  pAVar1->item = (QGraphicsLayoutItem *)0x0;
  pAVar1->graphicsAnchor = (QGraphicsAnchor *)0x0;
  pAVar1->field_0x78 = pAVar1->field_0x78 & 0x80;
  addAnchor_helper(this,firstItem,AnchorTop,firstItem,AnchorBottom,pAVar1);
  pAVar1->maxSize = 16777215.0;
  local_48.second = AnchorTop;
  local_48.first = firstItem;
  pVar2 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
          ::value(this_00,&local_48);
  (this->layoutFirstVertex).m_data[1] = pVar2.first;
  (this->layoutCentralVertex).m_data[1] = (AnchorVertex *)0x0;
  local_48.second = AnchorBottom;
  local_48.first = firstItem;
  pVar2 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
          ::value(this_00,&local_48);
  (this->layoutLastVertex).m_data[1] = pVar2.first;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::createLayoutEdges()
{
    Q_Q(QGraphicsAnchorLayout);
    QGraphicsLayoutItem *layout = q;

    // Horizontal
    AnchorData *data = new AnchorData;
    addAnchor_helper(layout, Qt::AnchorLeft, layout,
                     Qt::AnchorRight, data);
    data->maxSize = QWIDGETSIZE_MAX;

    // Save a reference to layout vertices
    layoutFirstVertex[Qt::Horizontal] = internalVertex(layout, Qt::AnchorLeft);
    layoutCentralVertex[Qt::Horizontal] = nullptr;
    layoutLastVertex[Qt::Horizontal] = internalVertex(layout, Qt::AnchorRight);

    // Vertical
    data = new AnchorData;
    addAnchor_helper(layout, Qt::AnchorTop, layout,
                     Qt::AnchorBottom, data);
    data->maxSize = QWIDGETSIZE_MAX;

    // Save a reference to layout vertices
    layoutFirstVertex[Qt::Vertical] = internalVertex(layout, Qt::AnchorTop);
    layoutCentralVertex[Qt::Vertical] = nullptr;
    layoutLastVertex[Qt::Vertical] = internalVertex(layout, Qt::AnchorBottom);
}